

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDemoWindowMisc(void)

{
  ImVec2 IVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ImGuiKeyData *pIVar5;
  char *pcVar6;
  unsigned_short *puVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ImVec2 IVar11;
  char label [32];
  int i_7;
  ImGuiMouseCursor current;
  char *mouse_cursors_names [9];
  ImVec2 mouse_delta;
  ImVec2 value_with_lock_threshold;
  ImVec2 value_raw;
  int button;
  int focus_ahead;
  int has_focus;
  bool focus_3;
  bool focus_2;
  bool focus_1;
  ImVec2 label_min;
  ImVec2 face_max;
  ImVec2 face_min;
  ImVec2 key_max;
  ImVec2 key_min;
  KeyLayoutData *key_data;
  int n;
  ImDrawList *draw_list;
  KeyLayoutData keys_to_display [15];
  ImVec2 start_pos;
  ImVec2 board_max;
  ImVec2 board_min;
  float key_row_offset;
  ImVec2 key_step;
  ImVec2 key_label_pos;
  float key_face_rounding;
  ImVec2 key_face_pos;
  ImVec2 key_face_size;
  float key_rounding;
  ImVec2 key_size;
  int i_6;
  int i_5;
  ImWchar c;
  int i_4;
  ImGuiKey key_2;
  ImGuiKey key_1;
  ImGuiKey key;
  ImGuiKey key_first;
  int i_3;
  int i_2;
  int i_1;
  int count;
  ImGuiIO *io;
  int i;
  char *lines [8];
  ImVec2 *in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  char *in_stack_fffffffffffffc18;
  ImGuiTextFilter *in_stack_fffffffffffffc20;
  ImGuiTextFilter *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  float in_stack_fffffffffffffc34;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  ImVec2 in_stack_fffffffffffffc40;
  uint in_stack_fffffffffffffc4c;
  ImVec2 in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc58;
  ImU32 in_stack_fffffffffffffc5c;
  ImVec2 *in_stack_fffffffffffffc60;
  ImVec2 *in_stack_fffffffffffffc68;
  ImDrawList *in_stack_fffffffffffffc70;
  uint local_380;
  undefined8 local_378;
  float in_stack_fffffffffffffc90;
  ImDrawFlags in_stack_fffffffffffffc94;
  float in_stack_fffffffffffffc98;
  ImU32 in_stack_fffffffffffffc9c;
  ImVec2 *in_stack_fffffffffffffca0;
  ImVec2 *in_stack_fffffffffffffca8;
  ImDrawList *in_stack_fffffffffffffcb0;
  float local_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  ImVec2 in_stack_fffffffffffffce8;
  float in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  uint in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffcfc;
  ImVec2 local_2fc;
  ImVec2 local_2f4;
  int local_2ec;
  uint local_2e8;
  ImVec2 local_2e4;
  byte local_2d9;
  ImVec2 local_2d8;
  byte local_2cd;
  ImVec2 local_2cc;
  byte local_2c1;
  ImVec2 local_2c0;
  ImVec2 local_2b8;
  ImVec2 local_2b0;
  ImVec2 local_2a8;
  ImVec2 local_2a0;
  ImVec2 local_298;
  ImVec2 local_290;
  ImVec2 local_288;
  int *local_280;
  int local_274;
  ImVec2 local_268;
  ImDrawList *local_260;
  int local_258 [93];
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  undefined4 local_cc;
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined4 local_b8;
  ImVec2 local_b4;
  ImVec2 local_ac;
  undefined4 local_a4;
  ImVec2 local_a0;
  uint local_98;
  uint local_94;
  ushort local_8e;
  int local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  undefined4 local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  ImGuiIO *local_68;
  int local_5c;
  undefined8 local_58 [11];
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x160d,"Filtering",GImGuiDemoMarkerCallbackUserData);
  }
  bVar2 = ImGui::CollapsingHeader
                    (in_stack_fffffffffffffc18,(ImGuiTreeNodeFlags)in_stack_fffffffffffffc14);
  if (bVar2) {
    if ((ShowDemoWindowMisc()::filter == '\0') &&
       (iVar3 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar3 != 0)) {
      ImGuiTextFilter::ImGuiTextFilter
                ((ImGuiTextFilter *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc28->InputBuf);
      __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowDemoWindowMisc::filter,&__dso_handle);
      __cxa_guard_release(&ShowDemoWindowMisc()::filter);
    }
    ImGui::Text(
               "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
               );
    ImGuiTextFilter::Draw
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
    memcpy(local_58,&PTR_anon_var_dwarf_45845_00219890,0x40);
    for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
      bVar2 = ImGuiTextFilter::PassFilter
                        (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20->InputBuf,
                         in_stack_fffffffffffffc18);
      if (bVar2) {
        ImGui::BulletText("%s",local_58[local_5c]);
      }
    }
  }
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x161f,"Inputs, Navigation & Focus",GImGuiDemoMarkerCallbackUserData);
  }
  bVar2 = ImGui::CollapsingHeader
                    (in_stack_fffffffffffffc18,(ImGuiTreeNodeFlags)in_stack_fffffffffffffc14);
  if (bVar2) {
    local_68 = ImGui::GetIO();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1625,"Inputs, Navigation & Focus/Output",GImGuiDemoMarkerCallbackUserData);
    }
    ImGui::SetNextItemOpen(true,2);
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      ImGui::Text("io.WantCaptureMouse: %d",(ulong)(local_68->WantCaptureMouse & 1));
      ImGui::Text("io.WantCaptureMouseUnlessPopupClose: %d",
                  (ulong)(local_68->WantCaptureMouseUnlessPopupClose & 1));
      ImGui::Text("io.WantCaptureKeyboard: %d",(ulong)(local_68->WantCaptureKeyboard & 1));
      ImGui::Text("io.WantTextInput: %d",(ulong)(local_68->WantTextInput & 1));
      ImGui::Text("io.WantSetMousePos: %d",(ulong)(local_68->WantSetMousePos & 1));
      ImGui::Text("io.NavActive: %d, io.NavVisible: %d",(ulong)(local_68->NavActive & 1),
                  (ulong)(local_68->NavVisible & 1));
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1633,"Inputs, Navigation & Focus/Mouse State",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      bVar2 = ImGui::IsMousePosValid((ImVec2 *)0x0);
      if (bVar2) {
        ImGui::Text((char *)(double)(local_68->MousePos).x,(double)(local_68->MousePos).y,
                    "Mouse pos: (%g, %g)");
      }
      else {
        ImGui::Text("Mouse pos: <INVALID>");
      }
      ImGui::Text((char *)(double)(local_68->MouseDelta).x,"Mouse delta: (%g, %g)");
      local_6c = 5;
      ImGui::Text("Mouse down:");
      for (local_70 = 0; (int)local_70 < local_6c; local_70 = local_70 + 1) {
        bVar2 = ImGui::IsMouseDown(local_70);
        if (bVar2) {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          ImGui::Text((char *)(double)local_68->MouseDownDuration[(int)local_70],"b%d (%.02f secs)",
                      (ulong)local_70);
        }
      }
      ImGui::Text("Mouse clicked:");
      for (local_74 = 0; (int)local_74 < local_6c; local_74 = local_74 + 1) {
        bVar2 = ImGui::IsMouseClicked
                          ((ImGuiMouseButton)in_stack_fffffffffffffc20,
                           SUB81((ulong)in_stack_fffffffffffffc18 >> 0x38,0));
        if (bVar2) {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          in_stack_fffffffffffffc4c = local_74;
          uVar4 = ImGui::GetMouseClickedCount(local_74);
          ImGui::Text("b%d (%d)",(ulong)in_stack_fffffffffffffc4c,(ulong)uVar4);
        }
      }
      ImGui::Text("Mouse released:");
      for (local_78 = 0; (int)local_78 < local_6c; local_78 = local_78 + 1) {
        bVar2 = ImGui::IsMouseReleased(local_78);
        if (bVar2) {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          ImGui::Text("b%d",(ulong)local_78);
        }
      }
      ImGui::Text((char *)(double)local_68->MouseWheel,"Mouse wheel: %.1f");
      ImGui::Text((char *)(double)local_68->PenPressure,"Pen Pressure: %.1f");
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1646,"Inputs, Navigation & Focus/Keyboard, Gamepad & Navigation State",
                 GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      local_7c = 0;
      ImGui::Text("Keys down:");
      for (local_80 = 0; (int)local_80 < 0x285; local_80 = local_80 + 1) {
        bVar2 = ShowDemoWindowMisc::funcs::IsLegacyNativeDupe(0);
        if ((!bVar2) && (bVar2 = ImGui::IsKeyDown((ImGuiKey)in_stack_fffffffffffffc14), bVar2)) {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          in_stack_fffffffffffffc40 =
               (ImVec2)ImGui::GetKeyName((ImGuiKey)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          uVar4 = local_80;
          pIVar5 = ImGui::GetKeyData((ImGuiKey)in_stack_fffffffffffffc14);
          ImGui::Text((char *)(double)pIVar5->DownDuration,"\"%s\" %d (%.02f secs)",
                      in_stack_fffffffffffffc40,(ulong)uVar4);
        }
      }
      ImGui::Text("Keys pressed:");
      for (local_84 = 0; (int)local_84 < 0x285; local_84 = local_84 + 1) {
        bVar2 = ShowDemoWindowMisc::funcs::IsLegacyNativeDupe(0);
        if ((!bVar2) &&
           (bVar2 = ImGui::IsKeyPressed((ImGuiKey)in_stack_fffffffffffffc20,
                                        SUB81((ulong)in_stack_fffffffffffffc18 >> 0x38,0)), bVar2))
        {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          pcVar6 = ImGui::GetKeyName((ImGuiKey)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          ImGui::Text("\"%s\" %d",pcVar6,(ulong)local_84);
        }
      }
      ImGui::Text("Keys released:");
      for (local_88 = 0; (int)local_88 < 0x285; local_88 = local_88 + 1) {
        bVar2 = ShowDemoWindowMisc::funcs::IsLegacyNativeDupe(0);
        if ((!bVar2) && (bVar2 = ImGui::IsKeyReleased((ImGuiKey)in_stack_fffffffffffffc14), bVar2))
        {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          pcVar6 = ImGui::GetKeyName((ImGuiKey)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          ImGui::Text("\"%s\" %d",pcVar6,(ulong)local_88);
        }
      }
      pcVar6 = "";
      if ((local_68->KeyCtrl & 1U) != 0) {
        pcVar6 = "CTRL ";
      }
      pcVar9 = "";
      if ((local_68->KeyShift & 1U) != 0) {
        pcVar9 = "SHIFT ";
      }
      pcVar8 = "";
      if ((local_68->KeyAlt & 1U) != 0) {
        pcVar8 = "ALT ";
      }
      pcVar10 = "";
      if ((local_68->KeySuper & 1U) != 0) {
        pcVar10 = "SUPER ";
      }
      ImGui::Text("Keys mods: %s%s%s%s",pcVar6,pcVar9,pcVar8,pcVar10);
      ImGui::Text("Chars queue:");
      for (local_8c = 0; local_8c < (local_68->InputQueueCharacters).Size; local_8c = local_8c + 1)
      {
        puVar7 = ImVector<unsigned_short>::operator[](&local_68->InputQueueCharacters,local_8c);
        local_8e = *puVar7;
        ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
        if ((local_8e < 0x21) || (0xff < local_8e)) {
          in_stack_fffffffffffffc3c = (float)CONCAT13(0x3f,SUB43(in_stack_fffffffffffffc3c,0));
        }
        else {
          in_stack_fffffffffffffc3c =
               (float)CONCAT13((char)local_8e,SUB43(in_stack_fffffffffffffc3c,0));
        }
        ImGui::Text("\'%c\' (0x%04X)",
                    (ulong)(uint)(int)(char)((uint)in_stack_fffffffffffffc3c >> 0x18),
                    (ulong)local_8e);
      }
      ImGui::Text("NavInputs down:");
      for (local_94 = 0; (int)local_94 < 0x14; local_94 = local_94 + 1) {
        if (0.0 < local_68->NavInputs[(int)local_94]) {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          ImGui::Text((char *)(double)local_68->NavInputs[(int)local_94],"[%d] %.2f (%.02f secs)",
                      (ulong)local_94);
        }
      }
      ImGui::Text("NavInputs pressed:");
      for (local_98 = 0; (int)local_98 < 0x14; local_98 = local_98 + 1) {
        if ((local_68->NavInputsDownDuration[(int)local_98] == 0.0) &&
           (!NAN(local_68->NavInputsDownDuration[(int)local_98]))) {
          ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
          ImGui::Text("[%d]",(ulong)local_98);
        }
      }
      ImVec2::ImVec2(&local_a0,35.0,35.0);
      local_a4 = 0x40400000;
      ImVec2::ImVec2(&local_ac,25.0,25.0);
      in_stack_fffffffffffffc38 = 5.0;
      in_stack_fffffffffffffc34 = 3.0;
      ImVec2::ImVec2(&local_b4,5.0,3.0);
      local_b8 = 0x40000000;
      ImVec2::ImVec2(&local_c0,7.0,4.0);
      ImVec2::ImVec2(&local_c8,local_a0.x - 1.0,local_a0.y - 1.0);
      local_cc = 0x41100000;
      local_d4 = ImGui::GetCursorScreenPos();
      ImVec2::ImVec2(&local_dc,local_c8.x * in_stack_fffffffffffffc34 + local_d4.x + 18.0 + 10.0,
                     local_c8.y * in_stack_fffffffffffffc34 + local_d4.y + 10.0);
      ImVec2::ImVec2(&local_e4,(local_d4.x + in_stack_fffffffffffffc38) - local_c8.x,local_d4.y);
      memcpy(local_258,&DAT_002198d0,0x168);
      local_260 = ImGui::GetWindowDrawList();
      local_268 = local_d4;
      IVar1.y = in_stack_fffffffffffffc3c;
      IVar1.x = in_stack_fffffffffffffc38;
      ImDrawList::PushClipRect
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc40,IVar1,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
      for (local_274 = 0; local_274 < 0xf; local_274 = local_274 + 1) {
        local_280 = local_258 + (long)local_274 * 6;
        ImVec2::ImVec2(&local_288,
                       (float)*local_280 * 9.0 +
                       (float)local_258[(long)local_274 * 6 + 1] * local_c8.x + local_e4.x,
                       (float)*local_280 * local_c8.y + local_e4.y);
        ImVec2::ImVec2(&local_290,local_288.x + local_a0.x,local_288.y + local_a0.y);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (ImVec2 *)in_stack_fffffffffffffc28,(ImVec2 *)in_stack_fffffffffffffc20,
                   (ImU32)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   SUB84(in_stack_fffffffffffffc18,0),(ImDrawFlags)in_stack_fffffffffffffc14);
        ImDrawList::AddRect(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                            in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,
                            in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                            in_stack_fffffffffffffc90);
        ImVec2::ImVec2(&local_298,local_288.x + local_b4.x,local_288.y + local_b4.y);
        ImVec2::ImVec2(&local_2a0,local_298.x + local_ac.x,local_298.y + local_ac.y);
        ImDrawList::AddRect(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                            in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,
                            in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                            in_stack_fffffffffffffc90);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (ImVec2 *)in_stack_fffffffffffffc28,(ImVec2 *)in_stack_fffffffffffffc20,
                   (ImU32)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                   SUB84(in_stack_fffffffffffffc18,0),(ImDrawFlags)in_stack_fffffffffffffc14);
        ImVec2::ImVec2(&local_2a8,local_288.x + local_c0.x,local_288.y + local_c0.y);
        ImDrawList::AddText((ImDrawList *)
                            CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                            (ImVec2 *)in_stack_fffffffffffffc28,
                            (ImU32)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                            in_stack_fffffffffffffc18,
                            (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        bVar2 = ImGui::IsKeyDown((ImGuiKey)in_stack_fffffffffffffc14);
        if (bVar2) {
          ImDrawList::AddRectFilled
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (ImVec2 *)in_stack_fffffffffffffc28,(ImVec2 *)in_stack_fffffffffffffc20,
                     (ImU32)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                     SUB84(in_stack_fffffffffffffc18,0),(ImDrawFlags)in_stack_fffffffffffffc14);
        }
      }
      ImDrawList::PopClipRect
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      ImVec2::ImVec2(&local_2b0,local_dc.x - local_d4.x,local_dc.y - local_d4.y);
      ImGui::Dummy((ImVec2 *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      ImGui::TreePop();
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      ImVec2::ImVec2(&local_2b8,0.0,0.0);
      ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                    in_stack_fffffffffffffc08);
      bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffc20);
      if (bVar2) {
        ImGui::CaptureKeyboardFromApp(true);
      }
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      ImVec2::ImVec2(&local_2c0,0.0,0.0);
      ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                    in_stack_fffffffffffffc08);
      bVar2 = ImGui::IsItemActive();
      if (bVar2) {
        ImGui::CaptureKeyboardFromApp(false);
      }
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1696,"Inputs, Navigation & Focus/Tabbing",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      ImGui::Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      ImGui::PushAllowKeyboardFocus(false);
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      HelpMarker((char *)0x1831a9);
      ImGui::PopAllowKeyboardFocus();
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x16a6,"Inputs, Navigation & Focus/Focus from code",
                 GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      ImVec2::ImVec2(&local_2cc,0.0,0.0);
      local_2c1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10
                                                ),in_stack_fffffffffffffc08);
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      ImVec2::ImVec2(&local_2d8,0.0,0.0);
      local_2cd = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10
                                                ),in_stack_fffffffffffffc08);
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      ImVec2::ImVec2(&local_2e4,0.0,0.0);
      local_2d9 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10
                                                ),in_stack_fffffffffffffc08);
      local_2e8 = 0;
      if ((local_2c1 & 1) != 0) {
        ImGui::SetKeyboardFocusHere((int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
      }
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      bVar2 = ImGui::IsItemActive();
      if (bVar2) {
        local_2e8 = 1;
      }
      if ((local_2cd & 1) != 0) {
        ImGui::SetKeyboardFocusHere((int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
      }
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      bVar2 = ImGui::IsItemActive();
      if (bVar2) {
        local_2e8 = 2;
      }
      ImGui::PushAllowKeyboardFocus(false);
      if ((local_2d9 & 1) != 0) {
        ImGui::SetKeyboardFocusHere((int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
      }
      ImGui::InputText((char *)in_stack_fffffffffffffc60,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (ImGuiInputTextCallback)in_stack_fffffffffffffc40,
                       (void *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      bVar2 = ImGui::IsItemActive();
      if (bVar2) {
        local_2e8 = 3;
      }
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      HelpMarker((char *)0x1833d4);
      ImGui::PopAllowKeyboardFocus();
      if (local_2e8 == 0) {
        ImGui::Text("Item with focus: <none>");
      }
      else {
        ImGui::Text("Item with focus: %d",(ulong)local_2e8);
      }
      local_2ec = -1;
      ImVec2::ImVec2(&local_2f4,0.0,0.0);
      bVar2 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                            in_stack_fffffffffffffc08);
      if (bVar2) {
        local_2ec = 0;
      }
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      ImVec2::ImVec2(&local_2fc,0.0,0.0);
      bVar2 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                            in_stack_fffffffffffffc08);
      if (bVar2) {
        local_2ec = 1;
      }
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffcfc,0.0,0.0);
      bVar2 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                            in_stack_fffffffffffffc08);
      if (bVar2) {
        local_2ec = 2;
      }
      if (local_2ec != -1) {
        ImGui::SetKeyboardFocusHere((int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
      }
      ImGui::SliderFloat3((char *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                          (float *)in_stack_fffffffffffffc28,
                          (float)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                          SUB84(in_stack_fffffffffffffc20,0),in_stack_fffffffffffffc18,
                          (ImGuiSliderFlags)in_stack_fffffffffffffc14);
      ImGui::TextWrapped(
                        "NB: Cursor & selection are preserved when refocusing last used item in code."
                        );
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x16d0,"Inputs, Navigation & Focus/Dragging",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      ImGui::TextWrapped(
                        "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                        );
      for (in_stack_fffffffffffffcf8 = 0; (int)in_stack_fffffffffffffcf8 < 3;
          in_stack_fffffffffffffcf8 = in_stack_fffffffffffffcf8 + 1) {
        ImGui::Text("IsMouseDragging(%d):",(ulong)in_stack_fffffffffffffcf8);
        bVar2 = ImGui::IsMouseDragging
                          ((ImGuiMouseButton)in_stack_fffffffffffffc10,
                           (float)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        ImGui::Text("  w/ default threshold: %d,",(ulong)bVar2);
        bVar2 = ImGui::IsMouseDragging
                          ((ImGuiMouseButton)in_stack_fffffffffffffc10,
                           (float)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        ImGui::Text("  w/ zero threshold: %d,",(ulong)bVar2);
        bVar2 = ImGui::IsMouseDragging
                          ((ImGuiMouseButton)in_stack_fffffffffffffc10,
                           (float)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        ImGui::Text("  w/ large threshold: %d,",(ulong)bVar2);
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffcf0,0.0,0.0);
      ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                    in_stack_fffffffffffffc08);
      bVar2 = ImGui::IsItemActive();
      if (bVar2) {
        ImGui::GetForegroundDrawList();
        in_stack_fffffffffffffc20 = (ImGuiTextFilter *)local_68->MouseClickedPos;
        ImGui::GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                           SUB84(in_stack_fffffffffffffc20,0));
        ImDrawList::AddLine(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                            in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                            in_stack_fffffffffffffc58);
      }
      in_stack_fffffffffffffc14 = 0.0;
      in_stack_fffffffffffffce8 =
           ImGui::GetMouseDragDelta
                     ((ImGuiMouseButton)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                      SUB84(in_stack_fffffffffffffc08,0));
      IVar11 = ImGui::GetMouseDragDelta
                         ((ImGuiMouseButton)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                          SUB84(in_stack_fffffffffffffc08,0));
      IVar1 = local_68->MouseDelta;
      ImGui::Text("GetMouseDragDelta(0):");
      local_320 = IVar11.x;
      fStack_31c = IVar11.y;
      ImGui::Text((char *)(double)local_320,(double)fStack_31c,
                  "  w/ default threshold: (%.1f, %.1f)");
      ImGui::Text((char *)(double)in_stack_fffffffffffffce8.x,(double)in_stack_fffffffffffffce8.y,
                  "  w/ zero threshold: (%.1f, %.1f)");
      local_328 = IVar1.x;
      fStack_324 = IVar1.y;
      ImGui::Text((char *)(double)local_328,(double)fStack_324,"io.MouseDelta: (%.1f, %.1f)");
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x16ed,"Inputs, Navigation & Focus/Mouse cursors",GImGuiDemoMarkerCallbackUserData
                );
    }
    bVar2 = ImGui::TreeNode((char *)in_stack_fffffffffffffc08);
    if (bVar2) {
      memcpy(&local_378,&DAT_00219a40,0x48);
      uVar4 = ImGui::GetMouseCursor();
      ImGui::Text("Current mouse cursor = %d: %s",(ulong)uVar4,(&local_378)[(int)uVar4]);
      ImGui::Text("Hover to see mouse cursors:");
      ImGui::SameLine(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
      HelpMarker((char *)0x183849);
      for (local_380 = 0; (int)local_380 < 9; local_380 = local_380 + 1) {
        sprintf(&stack0xfffffffffffffc58,"Mouse cursor %d: %s",(ulong)local_380,
                (&local_378)[(int)local_380]);
        ImGui::Bullet();
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffc50,0.0,0.0);
        ImGui::Selectable((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                          (bool)in_stack_fffffffffffffcf7,
                          (ImGuiSelectableFlags)in_stack_fffffffffffffcf0,
                          (ImVec2 *)in_stack_fffffffffffffce8);
        bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffc20);
        if (bVar2) {
          ImGui::SetMouseCursor(local_380);
        }
      }
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void ShowDemoWindowMisc()
{
    IMGUI_DEMO_MARKER("Filtering");
    if (ImGui::CollapsingHeader("Filtering"))
    {
        // Helper class to easy setup a text filter.
        // You may want to implement a more feature-full filtering scheme in your own application.
        static ImGuiTextFilter filter;
        ImGui::Text("Filter usage:\n"
                    "  \"\"         display all lines\n"
                    "  \"xxx\"      display lines containing \"xxx\"\n"
                    "  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n"
                    "  \"-xxx\"     hide lines containing \"xxx\"");
        filter.Draw();
        const char* lines[] = { "aaa1.c", "bbb1.c", "ccc1.c", "aaa2.cpp", "bbb2.cpp", "ccc2.cpp", "abc.h", "hello, world" };
        for (int i = 0; i < IM_ARRAYSIZE(lines); i++)
            if (filter.PassFilter(lines[i]))
                ImGui::BulletText("%s", lines[i]);
    }

    IMGUI_DEMO_MARKER("Inputs, Navigation & Focus");
    if (ImGui::CollapsingHeader("Inputs, Navigation & Focus"))
    {
        ImGuiIO& io = ImGui::GetIO();

        // Display ImGuiIO output flags
        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Output");
        ImGui::SetNextItemOpen(true, ImGuiCond_Once);
        if (ImGui::TreeNode("Output"))
        {
            ImGui::Text("io.WantCaptureMouse: %d", io.WantCaptureMouse);
            ImGui::Text("io.WantCaptureMouseUnlessPopupClose: %d", io.WantCaptureMouseUnlessPopupClose);
            ImGui::Text("io.WantCaptureKeyboard: %d", io.WantCaptureKeyboard);
            ImGui::Text("io.WantTextInput: %d", io.WantTextInput);
            ImGui::Text("io.WantSetMousePos: %d", io.WantSetMousePos);
            ImGui::Text("io.NavActive: %d, io.NavVisible: %d", io.NavActive, io.NavVisible);
            ImGui::TreePop();
        }

        // Display Mouse state
        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Mouse State");
        if (ImGui::TreeNode("Mouse State"))
        {
            if (ImGui::IsMousePosValid())
                ImGui::Text("Mouse pos: (%g, %g)", io.MousePos.x, io.MousePos.y);
            else
                ImGui::Text("Mouse pos: <INVALID>");
            ImGui::Text("Mouse delta: (%g, %g)", io.MouseDelta.x, io.MouseDelta.y);

            int count = IM_ARRAYSIZE(io.MouseDown);
            ImGui::Text("Mouse down:");         for (int i = 0; i < count; i++) if (ImGui::IsMouseDown(i))      { ImGui::SameLine(); ImGui::Text("b%d (%.02f secs)", i, io.MouseDownDuration[i]); }
            ImGui::Text("Mouse clicked:");      for (int i = 0; i < count; i++) if (ImGui::IsMouseClicked(i))   { ImGui::SameLine(); ImGui::Text("b%d (%d)", i, ImGui::GetMouseClickedCount(i)); }
            ImGui::Text("Mouse released:");     for (int i = 0; i < count; i++) if (ImGui::IsMouseReleased(i))  { ImGui::SameLine(); ImGui::Text("b%d", i); }
            ImGui::Text("Mouse wheel: %.1f", io.MouseWheel);
            ImGui::Text("Pen Pressure: %.1f", io.PenPressure); // Note: currently unused
            ImGui::TreePop();
        }

        // Display Keyboard/Mouse state
        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Keyboard, Gamepad & Navigation State");
        if (ImGui::TreeNode("Keyboard, Gamepad & Navigation State"))
        {
            // We iterate both legacy native range and named ImGuiKey ranges, which is a little odd but this allow displaying the data for old/new backends.
            // User code should never have to go through such hoops: old code may use native keycodes, new code may use ImGuiKey codes.
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
            struct funcs { static bool IsLegacyNativeDupe(ImGuiKey) { return false; } };
            const ImGuiKey key_first = ImGuiKey_NamedKey_BEGIN;
#else
            struct funcs { static bool IsLegacyNativeDupe(ImGuiKey key) { return key < 512 && ImGui::GetIO().KeyMap[key] != -1; } }; // Hide Native<>ImGuiKey duplicates when both exists in the array
            const ImGuiKey key_first = 0;
            //ImGui::Text("Legacy raw:");       for (ImGuiKey key = key_first; key < ImGuiKey_COUNT; key++) { if (io.KeysDown[key]) { ImGui::SameLine(); ImGui::Text("\"%s\" %d", ImGui::GetKeyName(key), key); } }
#endif
            ImGui::Text("Keys down:");          for (ImGuiKey key = key_first; key < ImGuiKey_COUNT; key++) { if (funcs::IsLegacyNativeDupe(key)) continue; if (ImGui::IsKeyDown(key)) { ImGui::SameLine(); ImGui::Text("\"%s\" %d (%.02f secs)", ImGui::GetKeyName(key), key, ImGui::GetKeyData(key)->DownDuration); } }
            ImGui::Text("Keys pressed:");       for (ImGuiKey key = key_first; key < ImGuiKey_COUNT; key++) { if (funcs::IsLegacyNativeDupe(key)) continue; if (ImGui::IsKeyPressed(key)) { ImGui::SameLine(); ImGui::Text("\"%s\" %d", ImGui::GetKeyName(key), key); } }
            ImGui::Text("Keys released:");      for (ImGuiKey key = key_first; key < ImGuiKey_COUNT; key++) { if (funcs::IsLegacyNativeDupe(key)) continue; if (ImGui::IsKeyReleased(key)) { ImGui::SameLine(); ImGui::Text("\"%s\" %d", ImGui::GetKeyName(key), key); } }
            ImGui::Text("Keys mods: %s%s%s%s", io.KeyCtrl ? "CTRL " : "", io.KeyShift ? "SHIFT " : "", io.KeyAlt ? "ALT " : "", io.KeySuper ? "SUPER " : "");
            ImGui::Text("Chars queue:");        for (int i = 0; i < io.InputQueueCharacters.Size; i++) { ImWchar c = io.InputQueueCharacters[i]; ImGui::SameLine();  ImGui::Text("\'%c\' (0x%04X)", (c > ' ' && c <= 255) ? (char)c : '?', c); } // FIXME: We should convert 'c' to UTF-8 here but the functions are not public.
            ImGui::Text("NavInputs down:");     for (int i = 0; i < IM_ARRAYSIZE(io.NavInputs); i++) if (io.NavInputs[i] > 0.0f)              { ImGui::SameLine(); ImGui::Text("[%d] %.2f (%.02f secs)", i, io.NavInputs[i], io.NavInputsDownDuration[i]); }
            ImGui::Text("NavInputs pressed:");  for (int i = 0; i < IM_ARRAYSIZE(io.NavInputs); i++) if (io.NavInputsDownDuration[i] == 0.0f) { ImGui::SameLine(); ImGui::Text("[%d]", i); }

            // Draw an arbitrary US keyboard layout to visualize translated keys
            {
                const ImVec2 key_size = ImVec2(35.0f, 35.0f);
                const float  key_rounding = 3.0f;
                const ImVec2 key_face_size = ImVec2(25.0f, 25.0f);
                const ImVec2 key_face_pos = ImVec2(5.0f, 3.0f);
                const float  key_face_rounding = 2.0f;
                const ImVec2 key_label_pos = ImVec2(7.0f, 4.0f);
                const ImVec2 key_step = ImVec2(key_size.x - 1.0f, key_size.y - 1.0f);
                const float  key_row_offset = 9.0f;

                ImVec2 board_min = ImGui::GetCursorScreenPos();
                ImVec2 board_max = ImVec2(board_min.x + 3 * key_step.x + 2 * key_row_offset + 10.0f, board_min.y + 3 * key_step.y + 10.0f);
                ImVec2 start_pos = ImVec2(board_min.x + 5.0f - key_step.x, board_min.y);

                struct KeyLayoutData { int Row, Col; const char* Label; ImGuiKey Key; };
                const KeyLayoutData keys_to_display[] =
                {
                    { 0, 0, "", ImGuiKey_Tab },      { 0, 1, "Q", ImGuiKey_Q }, { 0, 2, "W", ImGuiKey_W }, { 0, 3, "E", ImGuiKey_E }, { 0, 4, "R", ImGuiKey_R },
                    { 1, 0, "", ImGuiKey_CapsLock }, { 1, 1, "A", ImGuiKey_A }, { 1, 2, "S", ImGuiKey_S }, { 1, 3, "D", ImGuiKey_D }, { 1, 4, "F", ImGuiKey_F },
                    { 2, 0, "", ImGuiKey_LeftShift },{ 2, 1, "Z", ImGuiKey_Z }, { 2, 2, "X", ImGuiKey_X }, { 2, 3, "C", ImGuiKey_C }, { 2, 4, "V", ImGuiKey_V }
                };

                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                draw_list->PushClipRect(board_min, board_max, true);
                for (int n = 0; n < IM_ARRAYSIZE(keys_to_display); n++)
                {
                    const KeyLayoutData* key_data = &keys_to_display[n];
                    ImVec2 key_min = ImVec2(start_pos.x + key_data->Col * key_step.x + key_data->Row * key_row_offset, start_pos.y + key_data->Row * key_step.y);
                    ImVec2 key_max = ImVec2(key_min.x + key_size.x, key_min.y + key_size.y);
                    draw_list->AddRectFilled(key_min, key_max, IM_COL32(204, 204, 204, 255), key_rounding);
                    draw_list->AddRect(key_min, key_max, IM_COL32(24, 24, 24, 255), key_rounding);
                    ImVec2 face_min = ImVec2(key_min.x + key_face_pos.x, key_min.y + key_face_pos.y);
                    ImVec2 face_max = ImVec2(face_min.x + key_face_size.x, face_min.y + key_face_size.y);
                    draw_list->AddRect(face_min, face_max, IM_COL32(193, 193, 193, 255), key_face_rounding, ImDrawFlags_None, 2.0f);
                    draw_list->AddRectFilled(face_min, face_max, IM_COL32(252, 252, 252, 255), key_face_rounding);
                    ImVec2 label_min = ImVec2(key_min.x + key_label_pos.x, key_min.y + key_label_pos.y);
                    draw_list->AddText(label_min, IM_COL32(64, 64, 64, 255), key_data->Label);
                    if (ImGui::IsKeyDown(key_data->Key))
                        draw_list->AddRectFilled(key_min, key_max, IM_COL32(255, 0, 0, 128), key_rounding);
                }
                draw_list->PopClipRect();
                ImGui::Dummy(ImVec2(board_max.x - board_min.x, board_max.y - board_min.y));
            }
            ImGui::TreePop();
        }

        if (ImGui::TreeNode("Capture override"))
        {
            ImGui::Button("Hovering me sets the\nkeyboard capture flag");
            if (ImGui::IsItemHovered())
                ImGui::CaptureKeyboardFromApp(true);
            ImGui::SameLine();
            ImGui::Button("Holding me clears the\nthe keyboard capture flag");
            if (ImGui::IsItemActive())
                ImGui::CaptureKeyboardFromApp(false);
            ImGui::TreePop();
        }

        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Tabbing");
        if (ImGui::TreeNode("Tabbing"))
        {
            ImGui::Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
            static char buf[32] = "hello";
            ImGui::InputText("1", buf, IM_ARRAYSIZE(buf));
            ImGui::InputText("2", buf, IM_ARRAYSIZE(buf));
            ImGui::InputText("3", buf, IM_ARRAYSIZE(buf));
            ImGui::PushAllowKeyboardFocus(false);
            ImGui::InputText("4 (tab skip)", buf, IM_ARRAYSIZE(buf));
            ImGui::SameLine(); HelpMarker("Item won't be cycled through when using TAB or Shift+Tab.");
            ImGui::PopAllowKeyboardFocus();
            ImGui::InputText("5", buf, IM_ARRAYSIZE(buf));
            ImGui::TreePop();
        }

        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Focus from code");
        if (ImGui::TreeNode("Focus from code"))
        {
            bool focus_1 = ImGui::Button("Focus on 1"); ImGui::SameLine();
            bool focus_2 = ImGui::Button("Focus on 2"); ImGui::SameLine();
            bool focus_3 = ImGui::Button("Focus on 3");
            int has_focus = 0;
            static char buf[128] = "click on a button to set focus";

            if (focus_1) ImGui::SetKeyboardFocusHere();
            ImGui::InputText("1", buf, IM_ARRAYSIZE(buf));
            if (ImGui::IsItemActive()) has_focus = 1;

            if (focus_2) ImGui::SetKeyboardFocusHere();
            ImGui::InputText("2", buf, IM_ARRAYSIZE(buf));
            if (ImGui::IsItemActive()) has_focus = 2;

            ImGui::PushAllowKeyboardFocus(false);
            if (focus_3) ImGui::SetKeyboardFocusHere();
            ImGui::InputText("3 (tab skip)", buf, IM_ARRAYSIZE(buf));
            if (ImGui::IsItemActive()) has_focus = 3;
            ImGui::SameLine(); HelpMarker("Item won't be cycled through when using TAB or Shift+Tab.");
            ImGui::PopAllowKeyboardFocus();

            if (has_focus)
                ImGui::Text("Item with focus: %d", has_focus);
            else
                ImGui::Text("Item with focus: <none>");

            // Use >= 0 parameter to SetKeyboardFocusHere() to focus an upcoming item
            static float f3[3] = { 0.0f, 0.0f, 0.0f };
            int focus_ahead = -1;
            if (ImGui::Button("Focus on X")) { focus_ahead = 0; } ImGui::SameLine();
            if (ImGui::Button("Focus on Y")) { focus_ahead = 1; } ImGui::SameLine();
            if (ImGui::Button("Focus on Z")) { focus_ahead = 2; }
            if (focus_ahead != -1) ImGui::SetKeyboardFocusHere(focus_ahead);
            ImGui::SliderFloat3("Float3", &f3[0], 0.0f, 1.0f);

            ImGui::TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
            ImGui::TreePop();
        }

        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Dragging");
        if (ImGui::TreeNode("Dragging"))
        {
            ImGui::TextWrapped("You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget.");
            for (int button = 0; button < 3; button++)
            {
                ImGui::Text("IsMouseDragging(%d):", button);
                ImGui::Text("  w/ default threshold: %d,", ImGui::IsMouseDragging(button));
                ImGui::Text("  w/ zero threshold: %d,", ImGui::IsMouseDragging(button, 0.0f));
                ImGui::Text("  w/ large threshold: %d,", ImGui::IsMouseDragging(button, 20.0f));
            }

            ImGui::Button("Drag Me");
            if (ImGui::IsItemActive())
                ImGui::GetForegroundDrawList()->AddLine(io.MouseClickedPos[0], io.MousePos, ImGui::GetColorU32(ImGuiCol_Button), 4.0f); // Draw a line between the button and the mouse cursor

            // Drag operations gets "unlocked" when the mouse has moved past a certain threshold
            // (the default threshold is stored in io.MouseDragThreshold). You can request a lower or higher
            // threshold using the second parameter of IsMouseDragging() and GetMouseDragDelta().
            ImVec2 value_raw = ImGui::GetMouseDragDelta(0, 0.0f);
            ImVec2 value_with_lock_threshold = ImGui::GetMouseDragDelta(0);
            ImVec2 mouse_delta = io.MouseDelta;
            ImGui::Text("GetMouseDragDelta(0):");
            ImGui::Text("  w/ default threshold: (%.1f, %.1f)", value_with_lock_threshold.x, value_with_lock_threshold.y);
            ImGui::Text("  w/ zero threshold: (%.1f, %.1f)", value_raw.x, value_raw.y);
            ImGui::Text("io.MouseDelta: (%.1f, %.1f)", mouse_delta.x, mouse_delta.y);
            ImGui::TreePop();
        }

        IMGUI_DEMO_MARKER("Inputs, Navigation & Focus/Mouse cursors");
        if (ImGui::TreeNode("Mouse cursors"))
        {
            const char* mouse_cursors_names[] = { "Arrow", "TextInput", "ResizeAll", "ResizeNS", "ResizeEW", "ResizeNESW", "ResizeNWSE", "Hand", "NotAllowed" };
            IM_ASSERT(IM_ARRAYSIZE(mouse_cursors_names) == ImGuiMouseCursor_COUNT);

            ImGuiMouseCursor current = ImGui::GetMouseCursor();
            ImGui::Text("Current mouse cursor = %d: %s", current, mouse_cursors_names[current]);
            ImGui::Text("Hover to see mouse cursors:");
            ImGui::SameLine(); HelpMarker(
                "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. "
                "If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, "
                "otherwise your backend needs to handle it.");
            for (int i = 0; i < ImGuiMouseCursor_COUNT; i++)
            {
                char label[32];
                sprintf(label, "Mouse cursor %d: %s", i, mouse_cursors_names[i]);
                ImGui::Bullet(); ImGui::Selectable(label, false);
                if (ImGui::IsItemHovered())
                    ImGui::SetMouseCursor(i);
            }
            ImGui::TreePop();
        }
    }
}